

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O2

void google::protobuf::json_internal::ParseProto3Type::SetBool(Field f,Msg *msg,bool x)

{
  char b;
  
  RecordAsSeen(f,msg);
  io::CodedOutputStream::WriteVarint32(&msg->stream_,(f->raw_->field_0)._impl_.number_ << 3);
  b = x;
  io::CodedOutputStream::WriteRaw(&msg->stream_,&b,1);
  return;
}

Assistant:

static void SetBool(Field f, Msg& msg, bool x) {
    RecordAsSeen(f, msg);
    msg.stream_.WriteTag(f->proto().number() << 3);
    char b = x ? 0x01 : 0x00;
    msg.stream_.WriteRaw(&b, 1);
  }